

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_0::
     PrintFieldComment<google::protobuf::FieldDescriptor>(Printer *printer,FieldDescriptor *field)

{
  DebugStringOptions local_53;
  string local_50;
  string def;
  
  local_53.include_comments = false;
  local_53.elide_group_body = true;
  local_53.elide_oneof_body = true;
  FieldDescriptor::DebugStringWithOptions_abi_cxx11_(&def,field,&local_53);
  std::__cxx11::string::find((char)&def,10);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&def);
  io::Printer::Print(printer,"// $def$\n","def",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&def);
  return;
}

Assistant:

void PrintFieldComment(io::Printer* printer, const T* field) {
  // Print the field's (or oneof's) proto-syntax definition as a comment.
  // We don't want to print group bodies so we cut off after the first
  // line.
  DebugStringOptions options;
  options.elide_group_body = true;
  options.elide_oneof_body = true;
  string def = field->DebugStringWithOptions(options);
  printer->Print("// $def$\n",
    "def", def.substr(0, def.find_first_of('\n')));
}